

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O0

int __thiscall zmq::radio_t::xsetsockopt(radio_t *this,int option_,void *optval_,size_t optvallen_)

{
  int *piVar1;
  long in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  if ((in_RCX == 4) && (-1 < *in_RDX)) {
    if (in_ESI == 0x45) {
      *(bool *)(in_RDI + 0x768) = *in_RDX == 0;
      local_4 = 0;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      local_4 = -1;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::radio_t::xsetsockopt (int option_,
                               const void *optval_,
                               size_t optvallen_)
{
    if (optvallen_ != sizeof (int) || *static_cast<const int *> (optval_) < 0) {
        errno = EINVAL;
        return -1;
    }
    if (option_ == ZMQ_XPUB_NODROP)
        _lossy = (*static_cast<const int *> (optval_) == 0);
    else {
        errno = EINVAL;
        return -1;
    }
    return 0;
}